

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future_std.h
# Opt level: O1

unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_> __thiscall
prometheus::detail::make_unique<prometheus::Exposer,char_const(&)[12]>
          (detail *this,char (*args) [12])

{
  Exposer *this_00;
  size_t sVar1;
  string local_40;
  
  this_00 = (Exposer *)operator_new(0x48);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  sVar1 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,args,*args + sVar1);
  Exposer::Exposer(this_00,&local_40,2,(CivetCallbacks *)0x0);
  *(Exposer **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<prometheus::Exposer,_std::default_delete<prometheus::Exposer>,_true,_true>
         )(__uniq_ptr_data<prometheus::Exposer,_std::default_delete<prometheus::Exposer>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}